

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulsummaryxreftocsv.cpp
# Opt level: O2

void gulsummaryxreftocsv::doit(void)

{
  size_t sVar1;
  gulsummaryxref q;
  
  puts("\"coverage_id\", \"summary_id\", \"summaryset_id\"");
  sVar1 = fread(&q,0xc,1,_stdin);
  while (sVar1 != 0) {
    printf("%d, %d, %d\n",(ulong)(uint)q.coverage_id,(ulong)(uint)q.summary_id,
           (ulong)(uint)q.summaryset_id);
    sVar1 = fread(&q,0xc,1,_stdin);
  }
  return;
}

Assistant:

void doit()
	{

		printf("\"coverage_id\", \"summary_id\", \"summaryset_id\"\n");

		gulsummaryxref q;
		size_t i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf("%d, %d, %d\n", q.coverage_id, q.summary_id, q.summaryset_id);
			i = fread(&q, sizeof(q), 1, stdin);
		}
	}